

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

int __thiscall
H264StreamReader::getIdrPrevFrames(H264StreamReader *this,uint8_t *buff,uint8_t *bufEnd)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  byte *buff_00;
  bool bVar4;
  int unaff_R12D;
  bool bVar5;
  int local_bc;
  SliceUnit slice;
  
  buff_00 = NALUnit::findNextNAL
                      (buff + 4,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  local_bc = 0;
  for (; pbVar1 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,
      buff_00 < pbVar1;
      buff_00 = NALUnit::findNextNAL
                          (buff_00,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                   m_bufEnd)) {
    SliceUnit::SliceUnit(&slice);
    bVar4 = true;
    if (((*buff_00 & 0x1f) < 0x15) && ((0x10003eU >> (*buff_00 & 0x1f) & 1) != 0)) {
      iVar3 = deserializeSliceHeader(this,&slice,buff_00,bufEnd);
      if (iVar3 == 0) {
        bVar2 = SliceUnit::isIDR(&slice);
        bVar5 = slice.first_mb_in_slice != 0;
        iVar3 = unaff_R12D;
        if (!bVar5 && bVar2) {
          iVar3 = 0;
        }
        if (bVar5 || bVar2) {
          bVar4 = bVar5 || !bVar2;
          unaff_R12D = iVar3;
        }
        else if (1 << ((char)(slice.sps)->log2_max_pic_order_cnt_lsb - 1U & 0x1f) <
                 (int)(uint)slice.pic_order_cnt_lsb) {
          local_bc = local_bc + (uint)(slice.bottom_field_flag == 0);
        }
        else {
          bVar4 = false;
          unaff_R12D = local_bc;
        }
      }
      else {
        bVar4 = false;
        if (iVar3 == -10) {
          bVar4 = false;
          unaff_R12D = -((this->super_MPEGStreamReader).m_eof ^ 1);
        }
        else {
          unaff_R12D = 0;
        }
      }
    }
    NALUnit::~NALUnit(&slice.super_NALUnit);
    if (!bVar4) break;
  }
  iVar3 = -1;
  if (((this->super_MPEGStreamReader).m_eof & 1U) != 0) {
    iVar3 = local_bc;
  }
  if (buff_00 < pbVar1) {
    iVar3 = unaff_R12D;
  }
  return iVar3;
}

Assistant:

int H264StreamReader::getIdrPrevFrames(uint8_t *buff, const uint8_t *bufEnd)
{
    int prevPicCnt = 0;
    int deserializeRez;
    for (uint8_t *nal = NALUnit::findNextNAL(buff + 4, m_bufEnd); nal < m_bufEnd;
         nal = NALUnit::findNextNAL(nal, m_bufEnd))
    {
        SliceUnit slice;

        int MaxPicOrderCntLsbHalf;
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSliceIDR:
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            deserializeRez = deserializeSliceHeader(slice, nal, bufEnd);
            if (deserializeRez == NOT_ENOUGH_BUFFER && !m_eof)
                return -1;
            if (deserializeRez != 0)
                return 0;
            if (slice.isIDR() && slice.first_mb_in_slice == 0)
                return 0;
            if (slice.first_mb_in_slice != 0)
                break;
            MaxPicOrderCntLsbHalf = 1 << (slice.getSPS()->log2_max_pic_order_cnt_lsb - 1);
            if (slice.pic_order_cnt_lsb > MaxPicOrderCntLsbHalf)
            {
                if (slice.bottom_field_flag == 0)
                    prevPicCnt++;
            }
            else
                return prevPicCnt;
            break;
        default:
            break;
        }
    }
    if (m_eof)
        return prevPicCnt;
    return -1;
}